

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,float power)

{
  bool bVar1;
  float in_XMM0_Da;
  ImGuiSliderFlags slider_flags;
  char *in_stack_00000190;
  void *in_stack_00000198;
  void *in_stack_000001a0;
  void *in_stack_000001a8;
  ImGuiDataType in_stack_000001b4;
  char *in_stack_000001b8;
  ImGuiSliderFlags in_stack_000001d0;
  
  if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    bVar1 = false;
    if ((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0xc40,
                    "bool ImGui::SliderScalar(const char *, ImGuiDataType, void *, const void *, const void *, const char *, float)"
                   );
    }
  }
  bVar1 = SliderScalar(in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,in_stack_000001a0,
                       in_stack_00000198,in_stack_00000190,in_stack_000001d0);
  return bVar1;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags slider_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        slider_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return SliderScalar(label, data_type, p_data, p_min, p_max, format, slider_flags);
}